

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

Value * __thiscall Json::Value::resolveReference(Value *this,char *key,bool isStatic)

{
  ushort uVar1;
  _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  int iVar2;
  runtime_error *this_01;
  char *pcVar3;
  iterator iVar4;
  _Base_ptr p_Var5;
  CZString actualKey;
  value_type defaultValue;
  CZString local_a0;
  pair<const_Json::Value::CZString,_Json::Value> local_90;
  ValueHolder local_58;
  ushort local_50;
  undefined8 local_48;
  size_t local_40;
  size_t sStack_38;
  
  uVar1 = *(ushort *)&this->field_0x8;
  if ((char)uVar1 == '\0') {
    local_48 = 0;
    pcVar3 = (char *)operator_new(0x30);
    pcVar3[0x10] = '\0';
    pcVar3[0x11] = '\0';
    pcVar3[0x12] = '\0';
    pcVar3[0x13] = '\0';
    pcVar3[0x14] = '\0';
    pcVar3[0x15] = '\0';
    pcVar3[0x16] = '\0';
    pcVar3[0x17] = '\0';
    pcVar3[0x18] = '\0';
    pcVar3[0x19] = '\0';
    pcVar3[0x1a] = '\0';
    pcVar3[0x1b] = '\0';
    pcVar3[0x1c] = '\0';
    pcVar3[0x1d] = '\0';
    pcVar3[0x1e] = '\0';
    pcVar3[0x1f] = '\0';
    pcVar3[0] = '\0';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    pcVar3[8] = '\0';
    pcVar3[9] = '\0';
    pcVar3[10] = '\0';
    pcVar3[0xb] = '\0';
    pcVar3[0xc] = '\0';
    pcVar3[0xd] = '\0';
    pcVar3[0xe] = '\0';
    pcVar3[0xf] = '\0';
    *(char **)(pcVar3 + 0x18) = pcVar3 + 8;
    *(char **)(pcVar3 + 0x20) = pcVar3 + 8;
    pcVar3[0x28] = '\0';
    pcVar3[0x29] = '\0';
    pcVar3[0x2a] = '\0';
    pcVar3[0x2b] = '\0';
    pcVar3[0x2c] = '\0';
    pcVar3[0x2d] = '\0';
    pcVar3[0x2e] = '\0';
    pcVar3[0x2f] = '\0';
    local_58 = this->value_;
    (this->value_).string_ = pcVar3;
    *(ushort *)&this->field_0x8 = uVar1 & 0xfe00 | 7;
    local_50 = uVar1 & 0x1ff;
    local_40 = this->start_;
    sStack_38 = this->limit_;
    this->start_ = 0;
    this->limit_ = 0;
    ~Value((Value *)&local_58);
  }
  else if ((char)uVar1 != '\a') {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,"in Json::Value::resolveReference(): requires objectValue");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  CZString::CZString(&local_a0,key,(uint)!isStatic * 2);
  this_00 = &((this->value_).map_)->_M_t;
  iVar4 = std::
          _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
          ::_M_lower_bound(this_00,(_Link_type)
                                   (this_00->_M_impl).super__Rb_tree_header._M_header._M_parent,
                           &(this_00->_M_impl).super__Rb_tree_header._M_header,&local_a0);
  if ((_Rb_tree_header *)iVar4._M_node !=
      &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header) {
    p_Var5 = iVar4._M_node + 1;
    if (*(char **)(iVar4._M_node + 1) == (char *)0x0) {
      if (*(ArrayIndex *)&iVar4._M_node[1]._M_parent == local_a0.index_) goto LAB_0011292f;
    }
    else {
      iVar2 = strcmp(*(char **)(iVar4._M_node + 1),local_a0.cstr_);
      if (iVar2 == 0) goto LAB_0011292f;
    }
  }
  std::pair<const_Json::Value::CZString,_Json::Value>::pair<Json::Value::CZString_&,_true>
            (&local_90,&local_a0,(Value *)kNull);
  iVar4 = std::
          _Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
          ::_M_emplace_hint_unique<std::pair<Json::Value::CZString_const,Json::Value>&>
                    ((_Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                      *)(this->value_).map_,iVar4._M_node,&local_90);
  ~Value(&local_90.second);
  if ((local_90.first.cstr_ != (char *)0x0) && (local_90.first.index_ == 1)) {
    free(local_90.first.cstr_);
  }
  p_Var5 = iVar4._M_node + 1;
LAB_0011292f:
  if ((local_a0.cstr_ != (char *)0x0) && (local_a0.index_ == 1)) {
    free(local_a0.cstr_);
  }
  return (Value *)&p_Var5->_M_left;
}

Assistant:

Value& Value::resolveReference(const char* key, bool isStatic) {
  JSON_ASSERT_MESSAGE(
      type_ == nullValue || type_ == objectValue,
      "in Json::Value::resolveReference(): requires objectValue");
  if (type_ == nullValue)
    *this = Value(objectValue);
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  CZString actualKey(
      key, isStatic ? CZString::noDuplication : CZString::duplicateOnCopy);
  ObjectValues::iterator it = value_.map_->lower_bound(actualKey);
  if (it != value_.map_->end() && (*it).first == actualKey)
    return (*it).second;

  ObjectValues::value_type defaultValue(actualKey, null);
  it = value_.map_->insert(it, defaultValue);
  Value& value = (*it).second;
  return value;
#else
  return value_.map_->resolveReference(key, isStatic);
#endif
}